

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O0

void __thiscall amrex::FabArrayBase::RB90::~RB90(RB90 *this)

{
  CommMetaData::~CommMetaData(&this->super_CommMetaData);
  return;
}

Assistant:

FabArrayBase::RB90::~RB90 ()
{}